

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
* __thiscall
rangeless::fn::impl::take_while<rangeless::fn::impl::call_count_lt>::operator()
          (vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
           *__return_storage_ptr__,take_while<rangeless::fn::impl::call_count_lt> *this,
          vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
          *cont)

{
  __normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  local_60;
  const_iterator local_58;
  const_iterator local_50;
  size_t local_48;
  size_t local_40;
  vector<example::aln_t,_std::allocator<example::aln_t>_> *local_38;
  __normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  local_30;
  __normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  local_28;
  __normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  it;
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  *cont_local;
  take_while<rangeless::fn::impl::call_count_lt> *this_local;
  
  it._M_current = (vector<example::aln_t,_std::allocator<example::aln_t>_> *)cont;
  local_30._M_current =
       (vector<example::aln_t,_std::allocator<example::aln_t>_> *)
       std::
       vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
       ::begin(cont);
  local_38 = (vector<example::aln_t,_std::allocator<example::aln_t>_> *)
             std::
             vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             ::end(cont);
  local_48 = (this->pred).cap;
  local_40 = (this->pred).num_calls;
  local_28 = std::
             find_if_not<__gnu_cxx::__normal_iterator<std::vector<example::aln_t,std::allocator<example::aln_t>>*,std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>,rangeless::fn::impl::call_count_lt>
                       (local_30,(__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                                  )local_38,this->pred);
  __gnu_cxx::
  __normal_iterator<std::vector<example::aln_t,std::allocator<example::aln_t>>const*,std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>
  ::__normal_iterator<std::vector<example::aln_t,std::allocator<example::aln_t>>*>
            ((__normal_iterator<std::vector<example::aln_t,std::allocator<example::aln_t>>const*,std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>
              *)&local_50,&local_28);
  local_60._M_current =
       (vector<example::aln_t,_std::allocator<example::aln_t>_> *)
       std::
       vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
       ::end(cont);
  __gnu_cxx::
  __normal_iterator<std::vector<example::aln_t,std::allocator<example::aln_t>>const*,std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>
  ::__normal_iterator<std::vector<example::aln_t,std::allocator<example::aln_t>>*>
            ((__normal_iterator<std::vector<example::aln_t,std::allocator<example::aln_t>>const*,std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>
              *)&local_58,&local_60);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::erase(cont,local_50,local_58);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::vector(__return_storage_ptr__,cont);
  return __return_storage_ptr__;
}

Assistant:

Container operator()(Container cont) const
        {
            auto it = std::find_if_not(cont.begin(), cont.end(), pred);
            cont.erase(it, cont.end()); 
            return cont;
        }